

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

int32_t __thiscall cppnet::BufferQueue::MoveReadPt(BufferQueue *this,int32_t len)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  undefined1 local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<cppnet::BufferBlock> buffer_read;
  int32_t total_read_len;
  int32_t len_local;
  BufferQueue *this_local;
  
  buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 0;
  buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = len;
  List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_28);
  if ((int)buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ < 0) {
    peVar3 = std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    iVar2 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                      (peVar3,(ulong)buffer_read.
                                     super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
    buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = iVar2 + (int)buffer_read.
                               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
  }
  else {
    while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28), bVar1) {
      peVar3 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      iVar2 = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                        (peVar3,(ulong)(buffer_read.
                                        super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi._4_4_ -
                                       (int)buffer_read.
                                            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi));
      buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_4_ = iVar2 + (int)buffer_read.
                                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
      if ((int)buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ <=
          (int)buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi) break;
      bVar1 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_28,&this->_buffer_write);
      if (bVar1) {
        std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->_buffer_write);
        ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_48);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)local_48);
        if (!bVar1) {
          (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
          break;
        }
        std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->_buffer_write);
        ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_58);
        std::shared_ptr<cppnet::BufferBlock>::operator=
                  (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_58);
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)local_58);
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)(local_78 + 0x10));
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)(local_78 + 0x10));
      List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_78);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)local_28,
                 (shared_ptr<cppnet::BufferBlock> *)local_78);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_78)
      ;
    }
  }
  iVar2 = (int)buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  this->_can_read_length =
       this->_can_read_length -
       (int)buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_28);
  return iVar2;
}

Assistant:

int32_t BufferQueue::MoveReadPt(int32_t len) {
    int32_t total_read_len = 0;
    auto buffer_read = _buffer_list.GetHead();

    if (len >= 0) {
        while (buffer_read) {
            total_read_len += buffer_read->MoveReadPt(len - total_read_len);

            if (total_read_len >= len) {
                break;
            }

            if (buffer_read == _buffer_write) {
                if (_buffer_write->GetNext()) {
                    _buffer_write = _buffer_write->GetNext();

                } else {
                    Reset();
                    break;
                }
            }
            _buffer_list.PopFront();
            buffer_read = _buffer_list.GetHead();
        }

    } else {
        total_read_len += buffer_read->MoveReadPt(len);
    }

    _can_read_length -= total_read_len;
    return total_read_len;
}